

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

uint32_t ixgbe_get_link_speed(ixy_device *ixy)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((*(uint *)(ixy[1].pci_addr + 0x42a4) >> 0x1e & 1) != 0) {
    uVar1 = *(uint32_t *)
             (&DAT_00108800 + (ulong)(*(uint *)(ixy[1].pci_addr + 0x42a4) >> 0x1c & 3) * 4);
  }
  return uVar1;
}

Assistant:

uint32_t ixgbe_get_link_speed(const struct ixy_device* ixy) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	uint32_t links = get_reg32(dev->addr, IXGBE_LINKS);
	if (!(links & IXGBE_LINKS_UP)) {
		return 0;
	}
	switch (links & IXGBE_LINKS_SPEED_82599) {
		case IXGBE_LINKS_SPEED_100_82599:
			return 100;
		case IXGBE_LINKS_SPEED_1G_82599:
			return 1000;
		case IXGBE_LINKS_SPEED_10G_82599:
			return 10000;
		default:
			return 0;
	}
}